

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReceiver.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  long in_RSI;
  int in_EDI;
  uint8_t data [1];
  uint64_t nowUsec;
  uint64_t LastAdvertisementUsec;
  SDKJsonResult result;
  shared_ptr<MyClientConnection> connection;
  bool connectionFailed;
  MyClient client;
  string hostname;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  LogStringBuffer buffer_2;
  LogStringBuffer buffer_3;
  LogStringBuffer buffer_4;
  LogStringBuffer buffer_5;
  LogStringBuffer buffer_6;
  undefined4 in_stack_ffffffffffffe988;
  uint32_t in_stack_ffffffffffffe98c;
  LogStringBuffer *in_stack_ffffffffffffe990;
  atomic<bool> *in_stack_ffffffffffffe998;
  string *in_stack_ffffffffffffe9a0;
  SDKSocket *in_stack_ffffffffffffe9a8;
  MyClient **in_stack_ffffffffffffe9b8;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffe9c0;
  Channel *pCVar2;
  LogStringBuffer *in_stack_ffffffffffffe9c8;
  Channel *buffer_00;
  OutputWorker *in_stack_ffffffffffffe9d0;
  MyClient *in_stack_ffffffffffffea28;
  int local_14ac;
  duration<long,std::ratio<1l,1000l>> local_14a8 [8];
  TonkResult local_14a0;
  allocator local_1499;
  string local_1498 [39];
  undefined1 local_1471;
  uint64_t local_1470;
  uint64_t local_1468;
  string local_1460 [32];
  SDKResult local_1440 [10];
  undefined1 *local_1418;
  __shared_ptr<MyClientConnection,_(__gnu_cxx::_Lock_policy)2> local_1400;
  byte local_13e9;
  undefined1 local_13e8 [167];
  allocator local_1341;
  string local_1340 [32];
  long local_1320;
  int local_1318;
  int local_1314;
  char *local_1310;
  undefined2 *local_1308;
  char *local_1300;
  string *local_12f8;
  char *local_12f0;
  Channel *local_12e8;
  char *local_12e0;
  Channel *local_12d8;
  char *local_12d0;
  Channel *local_12c8;
  char *local_12c0;
  string *local_12b8;
  char *local_12b0;
  Channel *local_12a8;
  char *local_12a0;
  Channel *local_1298;
  char *local_1290;
  Channel *local_1288;
  char *local_1280;
  Channel *local_1278;
  char *local_1270;
  undefined2 *local_1268;
  char *local_1260;
  string *local_1258;
  char *local_1250;
  undefined4 local_1244;
  Channel *local_1240;
  undefined4 local_1234;
  Channel *local_1230;
  ostream aoStack_1208 [94];
  uint16_t in_stack_ffffffffffffee56;
  string *in_stack_ffffffffffffee58;
  SDKConnection *in_stack_ffffffffffffee60;
  SDKSocket *in_stack_ffffffffffffee68;
  undefined1 local_e40 [16];
  ostream aoStack_e30 [376];
  char *local_cb8;
  undefined4 local_cac;
  Channel *local_ca8;
  char *local_ca0;
  undefined8 local_c98;
  undefined1 *local_c90;
  Channel *local_c88;
  undefined8 local_c80;
  undefined1 *local_c78;
  Channel *local_c70;
  undefined8 local_c68;
  undefined1 *local_c60;
  char *local_c58;
  undefined1 *local_c50;
  Channel *local_c48;
  char *local_c40;
  undefined1 *local_c38;
  char *local_c30;
  undefined4 local_c24;
  Channel *local_c20;
  undefined4 local_c14;
  Channel *local_c10;
  undefined1 local_bf8 [16];
  ostream aoStack_be8 [376];
  char *local_a70;
  undefined4 local_a64;
  Channel *local_a60;
  char *local_a58;
  undefined8 local_a50;
  undefined1 *local_a48;
  Channel *local_a40;
  undefined8 local_a38;
  undefined1 *local_a30;
  Channel *local_a28;
  undefined8 local_a20;
  undefined1 *local_a18;
  char *local_a10;
  undefined1 *local_a08;
  Channel *local_a00;
  char *local_9f8;
  undefined1 *local_9f0;
  char *local_9e8;
  string *local_9e0;
  char *local_9d8;
  undefined4 local_9cc;
  Channel *local_9c8;
  undefined4 local_9bc;
  Channel *local_9b8;
  undefined1 local_9a0 [16];
  ostream aoStack_990 [376];
  char *local_818;
  string *local_810;
  char *local_808;
  undefined4 local_7fc;
  Channel *local_7f8;
  char *local_7f0;
  string *local_7e8;
  char *local_7e0;
  undefined8 local_7d8;
  undefined1 *local_7d0;
  Channel *local_7c8;
  undefined8 local_7c0;
  undefined1 *local_7b8;
  Channel *local_7b0;
  undefined8 local_7a8;
  undefined1 *local_7a0;
  char *local_798;
  string *local_790;
  char *local_788;
  undefined1 *local_780;
  Channel *local_778;
  char *local_770;
  undefined1 *local_768;
  Channel *local_760;
  char *local_758;
  undefined1 *local_750;
  char *local_748;
  string *local_740;
  undefined1 *local_738;
  Channel *local_730;
  string *local_728;
  undefined1 *local_720;
  Channel *local_718;
  string *local_710;
  undefined1 *local_708;
  char *local_700;
  undefined1 *local_6f8;
  Channel *local_6f0;
  char *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  undefined4 local_6cc;
  Channel *local_6c8;
  undefined4 local_6bc;
  Channel *local_6b8;
  undefined1 local_6a0 [16];
  ostream aoStack_690 [376];
  char *local_518;
  undefined4 local_50c;
  Channel *local_508;
  char *local_500;
  undefined8 local_4f8;
  undefined1 *local_4f0;
  Channel *local_4e8;
  undefined8 local_4e0;
  undefined1 *local_4d8;
  Channel *local_4d0;
  undefined8 local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  Channel *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  char *local_490;
  undefined4 local_484;
  Channel *local_480;
  undefined4 local_474;
  Channel *local_470;
  undefined1 local_458 [16];
  ostream aoStack_448 [376];
  char *local_2d0;
  undefined4 local_2c4;
  Channel *local_2c0;
  char *local_2b8;
  string *local_2b0;
  undefined1 *local_2a8;
  Channel *local_2a0;
  string *local_298;
  undefined1 *local_290;
  Channel *local_288;
  string *local_280;
  undefined1 *local_278;
  char *local_270;
  undefined1 *local_268;
  Channel *local_260;
  char *local_258;
  undefined1 *local_250;
  char *local_248;
  undefined4 local_23c;
  Channel *local_238;
  undefined4 local_22c;
  Channel *local_228;
  undefined1 local_210 [16];
  ostream aoStack_200 [376];
  char *local_88;
  undefined4 local_7c;
  Channel *local_78;
  char *local_70;
  string *local_68;
  undefined1 *local_60;
  Channel *local_58;
  string *local_50;
  undefined1 *local_48;
  Channel *local_40;
  string *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  Channel *local_18;
  char *local_10;
  undefined1 *local_8;
  
  local_1314 = 0;
  local_1320 = in_RSI;
  local_1318 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1340,"127.0.0.1",&local_1341);
  std::allocator<char>::~allocator((allocator<char> *)&local_1341);
  if (1 < local_1318) {
    std::__cxx11::string::operator=(local_1340,*(char **)(local_1320 + 8));
    local_12e8 = &Logger;
    local_12f0 = "Server hostname: ";
    local_1300 = ", port: ";
    local_1308 = &kFileSenderServerPort;
    local_1310 = " - Also broadcasting on the LAN to find server";
    local_1240 = &Logger;
    local_1244 = 2;
    local_1250 = "Server hostname: ";
    local_1260 = ", port: ";
    local_1268 = &kFileSenderServerPort;
    local_1270 = " - Also broadcasting on the LAN to find server";
    local_1230 = &Logger;
    local_1234 = 2;
    local_12f8 = local_1340;
    local_1258 = local_1340;
    if ((int)Logger.ChannelMinLevel < 3) {
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_ffffffffffffe990,
                 (char *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),Trace);
      std::operator<<(aoStack_1208,(string *)&Logger.Prefix);
      std::operator<<(aoStack_1208,"Server hostname: ");
      std::operator<<(aoStack_1208,local_1340);
      std::operator<<(aoStack_1208,", port: ");
      std::ostream::operator<<(aoStack_1208,0x285d);
      std::operator<<(aoStack_1208," - Also broadcasting on the LAN to find server");
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1088fa);
    }
  }
  MyClient::MyClient((MyClient *)in_stack_ffffffffffffe990);
  bVar1 = MyClient::Initialize(in_stack_ffffffffffffea28);
  if (bVar1) {
    local_12d8 = &Logger;
    local_12e0 = "File sending client started";
    if ((int)Logger.ChannelMinLevel < 2) {
      local_ca8 = &Logger;
      local_cac = 1;
      local_cb8 = "File sending client started";
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_ffffffffffffe990,
                 (char *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),Trace);
      local_c98 = 0x118328;
      local_c88 = &Logger;
      local_c90 = local_e40;
      local_ca0 = local_cb8;
      local_c70 = &Logger;
      local_c80 = local_c98;
      local_c78 = local_c90;
      local_c68 = local_c98;
      local_c60 = local_c90;
      std::operator<<(aoStack_e30,(string *)&Logger.Prefix);
      local_c48 = &Logger;
      local_c50 = local_c90;
      local_c58 = local_ca0;
      local_c38 = local_c90;
      local_c40 = local_ca0;
      std::operator<<((ostream *)(local_c90 + 0x10),local_ca0);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x108c4e);
    }
  }
  else {
    local_12c8 = &Logger;
    local_12d0 = "File sending server failed to start";
    local_c20 = &Logger;
    local_c24 = 1;
    local_c30 = "File sending server failed to start";
    local_c10 = &Logger;
    local_c14 = 1;
    if ((int)Logger.ChannelMinLevel < 2) {
      local_a60 = &Logger;
      local_a64 = 1;
      local_a70 = "File sending server failed to start";
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_ffffffffffffe990,
                 (char *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),Trace);
      local_a50 = 0x118328;
      local_a40 = &Logger;
      local_a48 = local_bf8;
      local_a58 = local_a70;
      local_a28 = &Logger;
      local_a38 = local_a50;
      local_a30 = local_a48;
      local_a20 = local_a50;
      local_a18 = local_a48;
      std::operator<<(aoStack_be8,(string *)&Logger.Prefix);
      local_a00 = &Logger;
      local_a08 = local_a48;
      local_a10 = local_a58;
      local_9f0 = local_a48;
      local_9f8 = local_a58;
      std::operator<<((ostream *)(local_a48 + 0x10),local_a58);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x108f2a);
    }
  }
  local_13e9 = 1;
  std::shared_ptr<MyClientConnection>::shared_ptr((shared_ptr<MyClientConnection> *)0x108f47);
  local_1418 = local_13e8;
  std::make_shared<MyClientConnection,MyClient*>(in_stack_ffffffffffffe9b8);
  std::shared_ptr<MyClientConnection>::operator=
            ((shared_ptr<MyClientConnection> *)in_stack_ffffffffffffe990,
             (shared_ptr<MyClientConnection> *)
             CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
  std::shared_ptr<MyClientConnection>::~shared_ptr((shared_ptr<MyClientConnection> *)0x108fa0);
  std::__shared_ptr<MyClientConnection,_(__gnu_cxx::_Lock_policy)2>::get(&local_1400);
  tonk::SDKSocket::Connect
            (in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
             in_stack_ffffffffffffee56);
  bVar1 = tonk::SDKResult::Failed(local_1440);
  if (bVar1) {
    tonk::SDKJsonResult::ToString_abi_cxx11_
              ((SDKJsonResult *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988));
    local_12a8 = &Logger;
    local_12b0 = "Client connection failed: ";
    local_12b8 = local_1460;
    local_12c0 = " - Going to advertise on the LAN looking for connections";
    local_9c8 = &Logger;
    local_9cc = 2;
    local_9d8 = "Client connection failed: ";
    local_9e8 = " - Going to advertise on the LAN looking for connections";
    local_9b8 = &Logger;
    local_9bc = 2;
    local_9e0 = local_12b8;
    if ((int)Logger.ChannelMinLevel < 3) {
      local_7f8 = &Logger;
      local_7fc = 2;
      local_808 = "Client connection failed: ";
      local_818 = " - Going to advertise on the LAN looking for connections";
      local_810 = local_12b8;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_ffffffffffffe990,
                 (char *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),Trace);
      local_7d8 = 0x118328;
      local_7c8 = &Logger;
      local_7d0 = local_9a0;
      local_7e0 = local_808;
      local_7e8 = local_810;
      local_7f0 = local_818;
      local_7b0 = &Logger;
      local_7c0 = local_7d8;
      local_7b8 = local_7d0;
      local_7a8 = local_7d8;
      local_7a0 = local_7d0;
      std::operator<<(aoStack_990,(string *)&Logger.Prefix);
      local_778 = &Logger;
      local_780 = local_7d0;
      local_788 = local_7e0;
      local_790 = local_7e8;
      local_798 = local_7f0;
      local_760 = &Logger;
      local_768 = local_7d0;
      local_770 = local_7e0;
      local_750 = local_7d0;
      local_758 = local_7e0;
      std::operator<<((ostream *)(local_7d0 + 0x10),local_7e0);
      local_730 = &Logger;
      local_738 = local_780;
      local_740 = local_790;
      local_748 = local_798;
      local_718 = &Logger;
      local_720 = local_780;
      local_728 = local_790;
      local_708 = local_780;
      local_710 = local_790;
      std::operator<<((ostream *)(local_780 + 0x10),local_790);
      local_6f0 = &Logger;
      local_6f8 = local_738;
      local_700 = local_748;
      local_6e0 = local_738;
      local_6e8 = local_748;
      std::operator<<((ostream *)(local_738 + 0x10),local_748);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x109483);
    }
    std::__cxx11::string::~string(local_1460);
  }
  else {
    local_13e9 = 0;
  }
  tonk::SDKJsonResult::~SDKJsonResult((SDKJsonResult *)0x109548);
  local_1468 = 0;
  while (bVar1 = std::atomic::operator_cast_to_bool(in_stack_ffffffffffffe998),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    local_1470 = tonk_time();
    if ((1000000 < local_1470 - local_1468) &&
       (local_1471 = 100, local_1468 = local_1470, (local_13e9 & 1) != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1498,"",&local_1499);
      local_14a0 = (TonkResult)
                   tonk::SDKSocket::Advertise
                             (in_stack_ffffffffffffe9a8,in_stack_ffffffffffffe9a0,
                              (uint16_t)((ulong)in_stack_ffffffffffffe998 >> 0x30),
                              in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c);
      std::__cxx11::string::~string(local_1498);
      std::allocator<char>::~allocator((allocator<char> *)&local_1499);
    }
    local_14ac = 10;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_14a8,&local_14ac);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_ffffffffffffe9c0);
  }
  local_1298 = &Logger;
  local_12a0 = "Client shutdown";
  local_6c8 = &Logger;
  local_6cc = 1;
  local_6d8 = "Client shutdown";
  local_6b8 = &Logger;
  local_6bc = 1;
  if ((int)Logger.ChannelMinLevel < 2) {
    local_508 = &Logger;
    local_50c = 1;
    local_518 = "Client shutdown";
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_ffffffffffffe990,
               (char *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),Trace);
    local_4f8 = 0x118328;
    local_4e8 = &Logger;
    local_4f0 = local_6a0;
    local_500 = local_518;
    local_4d0 = &Logger;
    local_4e0 = local_4f8;
    local_4d8 = local_4f0;
    local_4c8 = local_4f8;
    local_4c0 = local_4f0;
    std::operator<<(aoStack_690,(string *)&Logger.Prefix);
    local_4a8 = &Logger;
    local_4b0 = local_4f0;
    local_4b8 = local_500;
    local_498 = local_4f0;
    local_4a0 = local_500;
    std::operator<<((ostream *)(local_4f0 + 0x10),local_500);
    in_stack_ffffffffffffe9d0 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x109948);
  }
  std::shared_ptr<MyClientConnection>::~shared_ptr((shared_ptr<MyClientConnection> *)0x10995b);
  MyClient::~MyClient((MyClient *)0x109968);
  local_1288 = &Logger;
  local_1290 = "Press ENTER key to terminate";
  local_480 = &Logger;
  local_484 = 1;
  local_490 = "Press ENTER key to terminate";
  buffer_00 = &Logger;
  local_470 = &Logger;
  local_474 = 1;
  if ((int)Logger.ChannelMinLevel < 2) {
    local_2c0 = &Logger;
    local_2c4 = 1;
    local_2d0 = "Press ENTER key to terminate";
    pCVar2 = &Logger;
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_ffffffffffffe990,
               (char *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),Trace);
    local_2b0 = &pCVar2->Prefix;
    local_2a8 = local_458;
    local_2b8 = local_2d0;
    local_2a0 = pCVar2;
    local_298 = local_2b0;
    local_290 = local_2a8;
    local_288 = pCVar2;
    local_280 = local_2b0;
    local_278 = local_2a8;
    std::operator<<(aoStack_448,(string *)local_2b0);
    local_268 = local_2a8;
    local_270 = local_2b8;
    local_250 = local_2a8;
    local_258 = local_2b8;
    local_260 = pCVar2;
    std::operator<<((ostream *)(local_2a8 + 0x10),local_2b8);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_ffffffffffffe9d0,(LogStringBuffer *)buffer_00);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x109bc8);
  }
  getchar();
  local_1278 = &Logger;
  local_1280 = "...Key press detected.  Terminating..";
  local_238 = &Logger;
  local_23c = 1;
  local_248 = "...Key press detected.  Terminating..";
  local_228 = &Logger;
  local_22c = 1;
  if ((int)Logger.ChannelMinLevel < 2) {
    local_78 = &Logger;
    local_7c = 1;
    local_88 = "...Key press detected.  Terminating..";
    pCVar2 = &Logger;
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_ffffffffffffe990,
               (char *)CONCAT44(in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988),Trace);
    local_68 = &pCVar2->Prefix;
    local_60 = local_210;
    local_70 = local_88;
    local_58 = pCVar2;
    local_50 = local_68;
    local_48 = local_60;
    local_40 = pCVar2;
    local_38 = local_68;
    local_30 = local_60;
    std::operator<<(aoStack_200,(string *)local_68);
    local_20 = local_60;
    local_28 = local_70;
    local_8 = local_60;
    local_10 = local_70;
    local_18 = pCVar2;
    std::operator<<((ostream *)(local_60 + 0x10),local_70);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_ffffffffffffe9d0,(LogStringBuffer *)buffer_00);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x109e35);
  }
  local_1314 = 0;
  std::__cxx11::string::~string(local_1340);
  return local_1314;
}

Assistant:

int main(int argc, char** argv)
{
    std::string hostname = "127.0.0.1";

    if (argc >= 2) {
        hostname = argv[1];
        Logger.Info("Server hostname: ", hostname, ", port: ", kFileSenderServerPort,
            " - Also broadcasting on the LAN to find server");
    }

    {
        MyClient client;

        if (client.Initialize()) {
            Logger.Debug("File sending client started");
        }
        else {
            Logger.Debug("File sending server failed to start");
        }

        bool connectionFailed = true;

        std::shared_ptr<MyClientConnection> connection;

        {
            connection = std::make_shared<MyClientConnection>(&client);

            tonk::SDKJsonResult result = client.Connect(connection.get(), hostname, kFileSenderServerPort);

            if (result.Failed())
            {
                Logger.Info("Client connection failed: ", result.ToString(),
                    " - Going to advertise on the LAN looking for connections");
            }
            else
            {
                connectionFailed = false;
            }
        }

        uint64_t LastAdvertisementUsec = 0;

        while (!client.Complete)
        {
            uint64_t nowUsec = tonk_time();

            if (nowUsec - LastAdvertisementUsec > 1000 * 1000)
            {
                LastAdvertisementUsec = nowUsec;

                uint8_t data[1] = {
                    100
                };

                // Broadcast looking for server on LAN if connection failed
                if (connectionFailed) {
                    client.Advertise(TONK_BROADCAST, kFileSenderServerPort, data, 1);
                }
            }

            std::this_thread::sleep_for(std::chrono::milliseconds(10));
        }

        Logger.Debug("Client shutdown");
    }

    Logger.Debug("Press ENTER key to terminate");

    ::getchar();

    Logger.Debug("...Key press detected.  Terminating..");

    return 0;
}